

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

xmlRelaxNGDefinePtr_conflict
xmlRelaxNGParseExceptNameClass(xmlRelaxNGParserCtxtPtr ctxt,xmlNodePtr node,int attr)

{
  int iVar1;
  xmlRelaxNGDefinePtr_conflict pxVar2;
  xmlRelaxNGDefinePtr_conflict def;
  xmlRelaxNGDefinePtr_conflict pxVar3;
  xmlRelaxNGDefinePtr *ppxVar4;
  char *msg;
  xmlRelaxNGDefinePtr_conflict pxVar5;
  _xmlNode *node_00;
  
  if ((((node->ns == (xmlNs *)0x0) || (node->type != XML_ELEMENT_NODE)) ||
      (iVar1 = xmlStrEqual(node->name,(xmlChar *)"except"), iVar1 == 0)) ||
     (iVar1 = xmlStrEqual(node->ns->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0"),
     iVar1 == 0)) {
    msg = "Expecting an except node\n";
    iVar1 = 0x404;
  }
  else {
    if (node->next != (_xmlNode *)0x0) {
      xmlRngPErr(ctxt,node,0x405,"exceptNameClass allows only a single except node\n",(xmlChar *)0x0
                 ,(xmlChar *)0x0);
    }
    if (node->children != (_xmlNode *)0x0) {
      pxVar2 = xmlRelaxNGNewDefine(ctxt,node);
      if (pxVar2 == (xmlRelaxNGDefinePtr_conflict)0x0) {
        return (xmlRelaxNGDefinePtr_conflict)0x0;
      }
      pxVar2->type = XML_RELAXNG_EXCEPT;
      node_00 = node->children;
      if (node_00 == (_xmlNode *)0x0) {
        return pxVar2;
      }
      pxVar5 = (xmlRelaxNGDefinePtr_conflict)0x0;
      do {
        def = xmlRelaxNGNewDefine(ctxt,node_00);
        if (def == (xmlRelaxNGDefinePtr_conflict)0x0) {
          return pxVar2;
        }
        def->type = (uint)(attr != 0) * 5 + XML_RELAXNG_ELEMENT;
        pxVar3 = xmlRelaxNGParseNameClass(ctxt,node_00,def);
        if (pxVar3 != (xmlRelaxNGDefinePtr_conflict)0x0) {
          ppxVar4 = &pxVar5->next;
          if (pxVar5 == (xmlRelaxNGDefinePtr_conflict)0x0) {
            ppxVar4 = &pxVar2->content;
          }
          *ppxVar4 = def;
          pxVar5 = def;
        }
        node_00 = node_00->next;
      } while (node_00 != (_xmlNode *)0x0);
      return pxVar2;
    }
    msg = "except has no content\n";
    iVar1 = 0x403;
  }
  xmlRngPErr(ctxt,node,iVar1,msg,(xmlChar *)0x0,(xmlChar *)0x0);
  return (xmlRelaxNGDefinePtr_conflict)0x0;
}

Assistant:

static xmlRelaxNGDefinePtr
xmlRelaxNGParseExceptNameClass(xmlRelaxNGParserCtxtPtr ctxt,
                               xmlNodePtr node, int attr)
{
    xmlRelaxNGDefinePtr ret, cur, last = NULL;
    xmlNodePtr child;

    if (!IS_RELAXNG(node, "except")) {
        xmlRngPErr(ctxt, node, XML_RNGP_EXCEPT_MISSING,
                   "Expecting an except node\n", NULL, NULL);
        return (NULL);
    }
    if (node->next != NULL) {
        xmlRngPErr(ctxt, node, XML_RNGP_EXCEPT_MULTIPLE,
                   "exceptNameClass allows only a single except node\n",
                   NULL, NULL);
    }
    if (node->children == NULL) {
        xmlRngPErr(ctxt, node, XML_RNGP_EXCEPT_EMPTY, "except has no content\n",
                   NULL, NULL);
        return (NULL);
    }

    ret = xmlRelaxNGNewDefine(ctxt, node);
    if (ret == NULL)
        return (NULL);
    ret->type = XML_RELAXNG_EXCEPT;
    child = node->children;
    while (child != NULL) {
        cur = xmlRelaxNGNewDefine(ctxt, child);
        if (cur == NULL)
            break;
        if (attr)
            cur->type = XML_RELAXNG_ATTRIBUTE;
        else
            cur->type = XML_RELAXNG_ELEMENT;

        if (xmlRelaxNGParseNameClass(ctxt, child, cur) != NULL) {
            if (last == NULL) {
                ret->content = cur;
            } else {
                last->next = cur;
            }
            last = cur;
        }
        child = child->next;
    }

    return (ret);
}